

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_long>::on_num
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_long>
           *this)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  basic_format_specs<char> *pbVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  char cVar8;
  uint uVar9;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  _Alloc_hider _Var14;
  char *pcVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  size_type sVar19;
  uint uVar20;
  char *pcVar21;
  ulong uVar22;
  uint uVar23;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  string local_298;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_298,(locale_ref)(this->locale).locale_);
  if (local_298._M_string_length == 0) {
    on_dec(this);
    goto LAB_0020a77f;
  }
  cVar8 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
  if (cVar8 == '\0') {
    on_dec(this);
    goto LAB_0020a77f;
  }
  uVar13 = this->abs_value;
  lVar7 = 0x3f;
  if ((uVar13 | 1) != 0) {
    for (; (uVar13 | 1) >> lVar7 == 0; lVar7 = lVar7 + -1) {
    }
  }
  uVar3 = *(ushort *)(bsr2log10(int)::data + (uint)((int)lVar7 * 2));
  bVar6 = uVar13 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64_new + (ulong)uVar3 * 8);
  uVar23 = (uint)uVar3 - (uint)bVar6;
  _Var14._M_p = local_298._M_dataplus._M_p;
  uVar20 = uVar23;
  uVar11 = uVar23;
  if (local_298._M_string_length == 0) {
LAB_0020a571:
    uVar17 = uVar11;
    uVar9 = uVar20;
    if (_Var14._M_p == local_298._M_dataplus._M_p + local_298._M_string_length) goto LAB_0020a57c;
  }
  else {
    uVar17 = (int)local_298._M_string_length + uVar23;
    sVar19 = local_298._M_string_length;
    do {
      cVar2 = *_Var14._M_p;
      uVar9 = uVar20 - (int)cVar2;
      if ((uVar9 == 0 || (int)uVar20 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82))
      goto LAB_0020a571;
      uVar11 = uVar11 + 1;
      _Var14._M_p = _Var14._M_p + 1;
      sVar19 = sVar19 - 1;
      uVar20 = uVar9;
    } while (sVar19 != 0);
LAB_0020a57c:
    uVar17 = (int)(uVar9 - 1) / (int)(local_298._M_dataplus._M_p + local_298._M_string_length)[-1] +
             uVar17;
  }
  pcVar15 = local_278 + (int)uVar23;
  uVar16 = uVar13;
  if (99 < uVar13) {
    do {
      uVar13 = uVar16 / 100;
      *(undefined2 *)(pcVar15 + -2) = *(undefined2 *)(basic_data<void>::digits + (uVar16 % 100) * 2)
      ;
      pcVar15 = pcVar15 + -2;
      bVar5 = 9999 < uVar16;
      uVar16 = uVar13;
    } while (bVar5);
  }
  if (uVar13 < 10) {
    pcVar15[-1] = (byte)uVar13 | 0x30;
  }
  else {
    *(undefined2 *)(pcVar15 + -2) = *(undefined2 *)(basic_data<void>::digits + uVar13 * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0025a2a8;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar17 = uVar17 + this->prefix_size;
  if (-1 < (int)uVar17) {
    uVar13 = (ulong)uVar17;
    if (500 < uVar17) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar13);
    }
    pcVar15 = local_248.super_buffer<char>.ptr_;
    local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
    if (uVar13 <= local_248.super_buffer<char>.capacity_) {
      local_248.super_buffer<char>.size_ = uVar13;
    }
    pcVar21 = local_248.super_buffer<char>.ptr_ + (uVar13 - 1);
    if (1 < (int)uVar23) {
      uVar16 = (ulong)uVar23;
      iVar18 = ((uint)uVar3 - (uint)bVar6) + 1;
      iVar12 = 0;
      _Var14._M_p = local_298._M_dataplus._M_p;
      do {
        uVar16 = uVar16 - 1;
        pcVar1 = pcVar21 + -1;
        *pcVar21 = local_278[uVar16 & 0xffffffff];
        cVar2 = *_Var14._M_p;
        if ('\0' < cVar2) {
          iVar12 = iVar12 + 1;
          if ((cVar2 != '\x7f') && (iVar12 % (int)cVar2 == 0)) {
            if (_Var14._M_p + 1 != local_298._M_dataplus._M_p + local_298._M_string_length) {
              iVar12 = 0;
              _Var14._M_p = _Var14._M_p + 1;
            }
            pcVar21[-1] = cVar8;
            pcVar1 = pcVar21 + -2;
          }
        }
        pcVar21 = pcVar1;
        iVar18 = iVar18 + -1;
      } while (2 < iVar18);
    }
    *pcVar21 = local_278[0];
    if (this->prefix_size != 0) {
      pcVar21[-1] = '-';
    }
    pbVar4 = this->specs;
    uVar16 = (ulong)pbVar4->width;
    if (-1 < (long)uVar16) {
      uVar22 = 0;
      if (uVar13 <= uVar16) {
        uVar22 = uVar16 - uVar13;
      }
      uVar16 = uVar22 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                   (ulong)((byte)pbVar4->field_0x9 & 0xf)) & 0x3f);
      bVar10 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                         ((this->out).container,uVar16,&pbVar4->fill);
      bVar10 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                         (pcVar15,pcVar15 + uVar13,bVar10);
      bVar10 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                         (bVar10,uVar22 - uVar16,&pbVar4->fill);
      (this->out).container = bVar10.container;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_);
      }
LAB_0020a77f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      return;
    }
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }